

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_should_not_follow_too_deep_circular_references(void)

{
  cJSON *array;
  cJSON *pcVar1;
  cJSON *item;
  
  array = (cJSON *)(*global_hooks.allocate)(0x40);
  if (array != (cJSON *)0x0) {
    array->child = (cJSON *)0x0;
    *(undefined8 *)&array->type = 0;
    array->valuedouble = 0.0;
    array->string = (char *)0x0;
    array->valuestring = (char *)0x0;
    *(undefined8 *)&array->valueint = 0;
    array->next = (cJSON *)0x0;
    array->prev = (cJSON *)0x0;
    array->type = 0x20;
  }
  pcVar1 = (cJSON *)(*global_hooks.allocate)(0x40);
  if (pcVar1 != (cJSON *)0x0) {
    pcVar1->child = (cJSON *)0x0;
    *(undefined8 *)&pcVar1->type = 0;
    pcVar1->valuedouble = 0.0;
    pcVar1->string = (char *)0x0;
    pcVar1->valuestring = (char *)0x0;
    *(undefined8 *)&pcVar1->valueint = 0;
    pcVar1->next = (cJSON *)0x0;
    pcVar1->prev = (cJSON *)0x0;
    pcVar1->type = 0x20;
  }
  item = (cJSON *)(*global_hooks.allocate)(0x40);
  if (item != (cJSON *)0x0) {
    item->child = (cJSON *)0x0;
    *(undefined8 *)&item->type = 0;
    item->valuedouble = 0.0;
    item->string = (char *)0x0;
    item->valuestring = (char *)0x0;
    *(undefined8 *)&item->valueint = 0;
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    item->type = 0x20;
  }
  add_item_to_array(array,pcVar1);
  add_item_to_array(pcVar1,item);
  add_item_to_array(item,array);
  pcVar1 = cJSON_Duplicate_rec(array,0,1);
  if (pcVar1 != (cJSON *)0x0) {
    UnityFail(" Expected NULL",0xea);
  }
  if (item == (cJSON *)0x0) {
    pcVar1 = (cJSON *)0x0;
  }
  else {
    pcVar1 = item->child;
  }
  cJSON_DetachItemViaPointer(item,pcVar1);
  cJSON_Delete(array);
  return;
}

Assistant:

static void cjson_should_not_follow_too_deep_circular_references(void)
{
    cJSON *o = cJSON_CreateArray();
    cJSON *a = cJSON_CreateArray();
    cJSON *b = cJSON_CreateArray();
    cJSON *x;

    cJSON_AddItemToArray(o, a);
    cJSON_AddItemToArray(a, b);
    cJSON_AddItemToArray(b, o);

    x = cJSON_Duplicate(o, 1);
    TEST_ASSERT_NULL(x);
    cJSON_DetachItemFromArray(b, 0);
    cJSON_Delete(o);
}